

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatChains.cpp
# Opt level: O3

void __thiscall FatChains::chainsAnalysis(FatChains *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  ostream *poVar3;
  list<FatChain,_std::allocator<FatChain>_> orphanedChains;
  map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> chains;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  list<FatChain,_std::allocator<FatChain>_> local_b0;
  list<FatChain,_std::allocator<FatChain>_> local_98;
  _Rb_tree<int,_std::pair<const_int,_FatChain>,_std::_Select1st<std::pair<const_int,_FatChain>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
  local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_50;
  
  FatSystem::enableCache((this->super_FatModule).system);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Building the chains...",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  findChains((map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )&local_80,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," chains",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running the recursive differential analysis...",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->saveEntries = false;
  this->exploreDamaged = false;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  recursiveExploration
            (this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                   *)&local_80,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_50,
             (int)((this->super_FatModule).system)->rootDirectory,
             (vector<FatEntry,_std::allocator<FatEntry>_> *)0x0);
  local_b0.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
  super__List_node_base._M_next._0_4_ = 0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_50,(int *)&local_b0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Having a look at the chains...",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  this->saveEntries = true;
  exploreChains(this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                      *)&local_80,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_50);
  getOrphaned_abi_cxx11_
            (&local_b0,this,
             (map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )&local_80);
  std::__cxx11::list<FatChain,_std::allocator<FatChain>_>::list(&local_98,&local_b0);
  displayOrphaned(this,&local_98);
  while (local_98.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_98) {
    p_Var1 = (((_List_base<FatChain,_std::allocator<FatChain>_> *)
              &(local_98.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    operator_delete(local_98.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x30);
    local_98.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var1;
  }
  p_Var1 = (_List_node_base *)
           CONCAT44(local_b0.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
                    super__List_node_base._M_next._4_4_,
                    local_b0.super__List_base<FatChain,_std::allocator<FatChain>_>._M_impl._M_node.
                    super__List_node_base._M_next._0_4_);
  while (p_Var1 != (_List_node_base *)&local_b0) {
    p_Var2 = (((_List_base<FatChain,_std::allocator<FatChain>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1,0x30);
    p_Var1 = p_Var2;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_50);
  std::
  _Rb_tree<int,_std::pair<const_int,_FatChain>,_std::_Select1st<std::pair<const_int,_FatChain>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void FatChains::chainsAnalysis()
{
    system.enableCache();

    cout << "Building the chains..." << endl;
    map<int, FatChain> chains = findChains();

    /*
    map<int, FatChain>::iterator mit;
    for (mit=chains.begin(); mit!=chains.end(); mit++) {
        cout << mit->first << "~>" << mit->second.endCluster << endl;
    } 
    */

    cout << "Found " << chains.size() << " chains" << endl;
    cout << endl;

    cout << "Running the recursive differential analysis..." << endl;
    set<int> visited;
    saveEntries = false;
    exploreDamaged = false;
    recursiveExploration(chains, visited, system.rootDirectory);
    visited.insert(0);
    cout << endl;

    cout << "Having a look at the chains..." << endl;
    saveEntries = true;
    exploreChains(chains, visited);
   
    // Getting orphaned elements from the map
    list<FatChain> orphanedChains = getOrphaned(chains);
    displayOrphaned(orphanedChains);
}